

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O3

bool __thiscall
slang::ast::DiagnosticVisitor::handleDefault<slang::ast::LetDeclSymbol>
          (DiagnosticVisitor *this,LetDeclSymbol *symbol)

{
  bool bVar1;
  DeclaredType *this_00;
  long lVar2;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar3;
  
  if (((ulong)this->errorLimit < *this->numErrors) || (this->hierarchyProblem != false)) {
    bVar1 = false;
  }
  else {
    this_00 = Symbol::getDeclaredType(&symbol->super_Symbol);
    if (this_00 != (DeclaredType *)0x0) {
      DeclaredType::getType(this_00);
      DeclaredType::getInitializer(this_00);
    }
    sVar3 = Compilation::getAttributes(this->compilation,symbol);
    if (sVar3.size_ != 0) {
      lVar2 = 0;
      do {
        AttributeSymbol::getValue(*(AttributeSymbol **)((long)sVar3.data_ + lVar2));
        lVar2 = lVar2 + 8;
      } while (sVar3.size_ << 3 != lVar2);
    }
    ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false>::visitDefault<slang::ast::LetDeclSymbol>
              ((ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false> *)this,symbol);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool handleDefault(const T& symbol) {
        if (numErrors > errorLimit || hierarchyProblem)
            return false;

        if constexpr (std::is_base_of_v<Symbol, T>) {
            auto declaredType = symbol.getDeclaredType();
            if (declaredType) {
                declaredType->getType();
                declaredType->getInitializer();
            }

            if constexpr (std::is_same_v<ParameterSymbol, T> ||
                          std::is_same_v<EnumValueSymbol, T> ||
                          std::is_same_v<SpecparamSymbol, T>) {
                symbol.getValue();
            }

            for (auto attr : compilation.getAttributes(symbol))
                attr->getValue();
        }

        if constexpr (is_detected_v<getBody_t, T>) {
            auto& body = symbol.getBody();
            if (body.bad())
                return true;

            body.visit(*this);
        }

        visitDefault(symbol);
        return true;
    }